

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  bool bVar1;
  ostream *__lhs;
  pointer pMVar2;
  undefined8 *in_RDI;
  Colour colourGuard_1;
  Colour colourGuard;
  size_t N;
  const_iterator itEnd;
  undefined4 in_stack_ffffffffffffff28;
  Code in_stack_ffffffffffffff2c;
  pluralise *in_stack_ffffffffffffff30;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  in_stack_ffffffffffffff40;
  AssertionPrinter *this_00;
  undefined1 local_99 [97];
  MessageInfo *local_38;
  undefined8 local_30;
  difference_type local_28;
  MessageInfo *local_20;
  MessageInfo *local_18;
  
  local_18 = (MessageInfo *)
             clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                       ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)in_stack_ffffffffffffff30,
                     (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (!bVar1) {
    local_38 = (MessageInfo *)
               clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::cend
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_30 = in_RDI[5];
    local_20 = local_38;
    local_28 = std::
               distance<__gnu_cxx::__normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>>
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Colour::Colour((Colour *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    std::operator<<((ostream *)*in_RDI," with ");
    this_00 = (AssertionPrinter *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_99 + 1),"message",(allocator *)this_00);
    pluralise::pluralise
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),(string *)0x14a6fb);
    __lhs = Catch::operator<<((ostream *)in_stack_ffffffffffffff30,
                              (pluralise *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::operator<<(__lhs,':');
    pluralise::~pluralise((pluralise *)0x14a72e);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    Colour::~Colour((Colour *)0x14a74f);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)__lhs,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffff2c,
                                                   in_stack_ffffffffffffff28)), bVar1) {
      if (((*(byte *)(in_RDI + 6) & 1) == 0) &&
         (pMVar2 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                 *)(in_RDI + 5)), pMVar2->type == Info)) {
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator++((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)(in_RDI + 5));
      }
      else {
        printMessage(this_00);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                            *)__lhs,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                          );
        if (bVar1) {
          anon_unknown.dwarf_a08c0::dimColour();
          Colour::Colour((Colour *)__lhs,in_stack_ffffffffffffff2c);
          std::operator<<((ostream *)*in_RDI," and");
          Colour::~Colour((Colour *)0x14a7eb);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = dimColour()) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(std::distance(itMessage, itEnd));

        {
            Colour colourGuard(colour);
            stream << " with " << pluralise(N, "message") << ':';
        }

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    Colour colourGuard(dimColour());
                    stream << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }